

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Namespace * soul::AST::createRootNamespace(Allocator *a)

{
  Namespace *pNVar1;
  Identifier rootNamespaceName;
  CodeLocation local_48;
  Context local_38;
  Identifier local_18;
  
  local_38.location.sourceCode.object = (SourceCodeText *)0x275276;
  local_18 = Allocator::get<char_const*>(a,(char **)&local_38);
  local_48.sourceCode.object = (SourceCodeText *)0x0;
  local_48.location.data = (char *)0x0;
  local_38.location.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.location.data = (char *)0x0;
  local_38.parentScope = (Scope *)0x0;
  pNVar1 = PoolAllocator::
           allocate<soul::AST::Namespace,soul::CodeLocation,soul::AST::Context,soul::Identifier&>
                     (&a->pool,&local_48,&local_38,&local_18);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_38);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_48.sourceCode);
  return pNVar1;
}

Assistant:

static Namespace& createRootNamespace (Allocator& a)
    {
        auto rootNamespaceName = a.get (Program::getRootNamespaceName());
        return a.allocate<Namespace> (CodeLocation(), Context(), rootNamespaceName);
    }